

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitAlphaYUV(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long *in_RSI;
  int *in_RDI;
  int j;
  uint8_t *dst;
  int mb_h;
  int mb_w;
  WebPYUVABuffer *buf;
  uint8_t *alpha;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  void *local_38;
  void *local_20;
  
  local_20 = *(void **)(in_RDI + 0x26);
  lVar3 = *in_RSI;
  iVar1 = in_RDI[3];
  iVar2 = in_RDI[4];
  local_38 = (void *)(*(long *)(lVar3 + 0x28) + (long)in_RDI[2] * (long)*(int *)(lVar3 + 0x3c));
  if (local_20 == (void *)0x0) {
    if (*(long *)(lVar3 + 0x28) != 0) {
      FillAlphaPlane((uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    }
  }
  else {
    for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
      memcpy(local_38,local_20,(long)iVar1);
      local_20 = (void *)((long)local_20 + (long)*in_RDI);
      local_38 = (void *)((long)local_38 + (long)*(int *)(lVar3 + 0x3c));
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaYUV(const VP8Io* const io, WebPDecParams* const p,
                        int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  const WebPYUVABuffer* const buf = &p->output->u.YUVA;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  uint8_t* dst = buf->a + (size_t)io->mb_y * buf->a_stride;
  int j;
  (void)expected_num_lines_out;
  assert(expected_num_lines_out == mb_h);
  if (alpha != NULL) {
    for (j = 0; j < mb_h; ++j) {
      memcpy(dst, alpha, mb_w * sizeof(*dst));
      alpha += io->width;
      dst += buf->a_stride;
    }
  } else if (buf->a != NULL) {
    // the user requested alpha, but there is none, set it to opaque.
    FillAlphaPlane(dst, mb_w, mb_h, buf->a_stride);
  }
  return 0;
}